

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void putRGBUAseparate8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  byte bVar1;
  uint8_t *puVar2;
  uint8_t *m;
  uint32_t av;
  uint32_t bv;
  uint32_t gv;
  uint32_t rv;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  _y_local = cp;
  for (gv = h; w_local = w, gv != 0; gv = gv - 1) {
    for (; w_local != 0; w_local = w_local - 1) {
      bVar1 = *a;
      puVar2 = img->UaToAa;
      *_y_local = CONCAT13(bVar1,CONCAT12(puVar2[(ulong)*b + (ulong)bVar1 * 0x100],
                                          CONCAT11(puVar2[(ulong)*g + (ulong)bVar1 * 0x100],
                                                   puVar2[(ulong)*r + (ulong)bVar1 * 0x100])));
      r = r + 1;
      g = g + 1;
      b = b + 1;
      a = a + 1;
      _y_local = _y_local + 1;
    }
    r = r + fromskew;
    g = g + fromskew;
    b = b + fromskew;
    a = a + fromskew;
    _y_local = _y_local + toskew;
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBUAseparate8bittile)
{
    (void)img;
    (void)y;
    for (; h > 0; --h)
    {
        uint32_t rv, gv, bv, av;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            av = *a++;
            m = img->UaToAa + ((size_t)av << 8);
            rv = m[*r++];
            gv = m[*g++];
            bv = m[*b++];
            *cp++ = PACK4(rv, gv, bv, av);
        }
        SKEW4(r, g, b, a, fromskew);
        cp += toskew;
    }
}